

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  bool bVar1;
  char *pcVar2;
  char *imp;
  char *loc;
  string impProp;
  string suffix;
  string desired_config;
  allocator<char> local_b1;
  char *local_b0;
  char *local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmTarget.cxx"
                  ,0x64f,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
                 );
  }
  std::__cxx11::string::string((string *)&local_40,(string *)config);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_40);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.field_2._M_local_buf[0] = '\0';
  if (this->TargetTypeValue == INTERFACE_LIBRARY) goto LAB_001c8867;
  bVar1 = GetMappedConfig(this,&local_40,&local_a8,&local_b0,&local_60);
  if (!bVar1) goto LAB_001c8867;
  if (artifact == RuntimeBinaryArtifact) {
    if (local_a8 != (char *)0x0) {
LAB_001c8787:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      goto LAB_001c8867;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"IMPORTED_LOCATION",(allocator<char> *)&local_a0);
    std::__cxx11::string::append((string *)&local_80);
    pcVar2 = GetProperty(this,&local_80);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"IMPORTED_LOCATION",&local_b1);
      pcVar2 = GetProperty(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    if (artifact != ImportLibraryArtifact) goto LAB_001c8867;
    if (local_b0 != (char *)0x0) goto LAB_001c8787;
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
      if (!bVar1) goto LAB_001c8867;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"IMPORTED_IMPLIB",(allocator<char> *)&local_a0);
    std::__cxx11::string::append((string *)&local_80);
    pcVar2 = GetProperty(this,&local_80);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"IMPORTED_IMPLIB",&local_b1);
      pcVar2 = GetProperty(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
LAB_001c8867:
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  const char* loc = nullptr;
  const char* imp = nullptr;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, &loc, &imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = loc;
        } else {
          std::string impProp = "IMPORTED_LOCATION";
          impProp += suffix;
          if (const char* config_location = this->GetProperty(impProp)) {
            result = config_location;
          } else if (const char* location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = "IMPORTED_IMPLIB";
          impProp += suffix;
          if (const char* config_implib = this->GetProperty(impProp)) {
            result = config_implib;
          } else if (const char* implib =
                       this->GetProperty("IMPORTED_IMPLIB")) {
            result = implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    result = this->GetName();
    result += "-NOTFOUND";
  }
  return result;
}